

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent
          (InMemoryDirectory *this,StringPtr name,WriteMode mode)

{
  undefined8 ctx;
  bool bVar1;
  WriteMode WVar2;
  Impl *pIVar3;
  Own<const_kj::Directory,_std::nullptr_t> *this_00;
  Directory *__fn;
  undefined4 in_register_0000000c;
  void *__child_stack;
  Directory *extraout_RDX;
  WriteMode in_R8D;
  void *__arg;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar4;
  StringPtr name_00;
  bool local_c3;
  Fault local_c0;
  Fault f;
  undefined1 local_a8 [24];
  Own<const_kj::Directory,_std::nullptr_t> local_90;
  undefined8 local_80;
  EntryImpl *entry;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  EntryImpl *_entry1764;
  WriteMode local_48;
  WriteMode parentMode;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  StringPtr name_local;
  
  name_00.content.size_ = (EntryImpl *)name.content.size_;
  lock.ptr._4_4_ = in_R8D;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&parentMode,
             name.content.ptr + 0x18);
  bVar1 = has<kj::WriteMode,void>(lock.ptr._4_4_,CREATE);
  local_c3 = false;
  if (bVar1) {
    local_c3 = has<kj::WriteMode,void>(lock.ptr._4_4_,CREATE_PARENT);
  }
  WVar2 = operator|(CREATE,MODIFY);
  local_48 = MODIFY;
  if (local_c3 != false) {
    local_48 = WVar2;
  }
  pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                     ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&parentMode);
  __arg = (void *)(ulong)local_48;
  name_00.content.ptr = (char *)pIVar3;
  entry = name_00.content.size_;
  uStack_70 = CONCAT44(in_register_0000000c,mode);
  Impl::openEntry((Impl *)local_68,name_00,mode);
  local_68._8_8_ =
       kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                 ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)local_68);
  if ((EntryImpl *)local_68._8_8_ != (EntryImpl *)0x0) {
    local_80 = local_68._8_8_;
    bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::is<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                      (&((EntryImpl *)local_68._8_8_)->node);
    if (bVar1) {
      this_00 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                 ::get<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                           ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                             *)(local_80 + 0x18))->directory;
      __fn = Own<const_kj::Directory,_std::nullptr_t>::operator->(this_00);
      Directory::clone((Directory *)(local_a8 + 0x18),(__fn *)__fn,__child_stack,mode,__arg);
      Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)this,
                 (Own<const_kj::Directory,_std::nullptr_t> *)(local_a8 + 0x18));
      Own<const_kj::Directory,_std::nullptr_t>::~Own
                ((Own<const_kj::Directory,_std::nullptr_t> *)(local_a8 + 0x18));
      local_a8._20_4_ = 1;
      goto LAB_0089cd51;
    }
    bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::operator==((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                          *)(local_80 + 0x18),(void *)0x0);
    if (bVar1) {
      pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&parentMode)
      ;
      Impl::modified(pIVar3);
      ctx = local_80;
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&parentMode);
      Impl::newDirectory((Impl *)&f);
      EntryImpl::init((EntryImpl *)local_a8,(EVP_PKEY_CTX *)ctx);
      Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)this,
                 (Own<const_kj::Directory,_std::nullptr_t> *)local_a8);
      Own<const_kj::Directory,_std::nullptr_t>::~Own
                ((Own<const_kj::Directory,_std::nullptr_t> *)local_a8);
      DirectoryNode::~DirectoryNode((DirectoryNode *)&f);
      local_a8._20_4_ = 1;
      goto LAB_0089cd51;
    }
  }
  bVar1 = has<kj::WriteMode,void>(lock.ptr._4_4_,CREATE);
  if (bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x6f1,FAILED,(char *)0x0,"\"parent is not a directory\"",
               (char (*) [26])"parent is not a directory");
    Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)this);
    local_a8._20_4_ = 1;
    kj::_::Debug::Fault::~Fault(&local_c0);
  }
  else {
    Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)this);
    local_a8._20_4_ = 1;
  }
LAB_0089cd51:
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&parentMode);
  MVar4.ptr.ptr = extraout_RDX;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<Own<const Directory>> tryGetParent(kj::StringPtr name, WriteMode mode) const {
    // Get a directory which is a parent of the eventual target. If `mode` includes
    // WriteMode::CREATE_PARENTS, possibly create the parent directory.

    auto lock = impl.lockExclusive();

    WriteMode parentMode = has(mode, WriteMode::CREATE) && has(mode, WriteMode::CREATE_PARENT)
        ? WriteMode::CREATE | WriteMode::MODIFY   // create parent
        : WriteMode::MODIFY;                      // don't create parent

    // Possibly create parent.
    KJ_IF_SOME(entry, lock->openEntry(name, parentMode)) {
      if (entry.node.is<DirectoryNode>()) {
        return entry.node.get<DirectoryNode>().directory->clone();
      } else if (entry.node == nullptr) {
        lock->modified();
        return entry.init(DirectoryNode { lock->newDirectory() });
      }
      // Continue on.
    }

    if (has(mode, WriteMode::CREATE)) {
      // CREATE is documented as returning null when the file already exists. In this case, the
      // file does NOT exist because the parent directory does not exist or is not a directory.
      KJ_FAIL_REQUIRE("parent is not a directory") { return kj::none; }
    } else {
      return kj::none;
    }
  }